

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O3

void bfgs_iter_start<sparse_parameters>
               (vw *all,bfgs *b,float *mem,int *lastj,double importance_weight_sum,int *origin,
               sparse_parameters *weights)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  *origin = 0;
  for (p_Var1 = (weights->_map)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    iVar5 = b->mem_stride;
    lVar4 = ((ulong)p_Var1[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) * (long)iVar5;
    iVar3 = *origin;
    if (0 < b->m) {
      mem[lVar4 + (iVar3 + 1) % iVar5] = *(float *)&(p_Var1[2]._M_nxt)->_M_nxt;
      iVar3 = *origin;
      iVar5 = b->mem_stride;
    }
    mem[lVar4 + iVar3 % iVar5] = *(float *)((long)&(p_Var1[2]._M_nxt)->_M_nxt + 4);
    p_Var2 = p_Var1[2]._M_nxt;
    *(float *)&p_Var2[1]._M_nxt =
         -*(float *)((long)&p_Var2[1]._M_nxt + 4) * *(float *)((long)&p_Var2->_M_nxt + 4);
    *(undefined4 *)((long)&(p_Var1[2]._M_nxt)->_M_nxt + 4) = 0;
  }
  *lastj = 0;
  if (all->quiet == false) {
    bfgs_iter_start<sparse_parameters>();
  }
  return;
}

Assistant:

void bfgs_iter_start(vw& all, bfgs& b, float* mem, int& lastj, double importance_weight_sum, int& origin, T& weights)
{
  double g1_Hg1 = 0.;
  double g1_g1 = 0.;

  origin = 0;
  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    float* mem1 = mem + (w.index() >> weights.stride_shift()) * b.mem_stride;
    if (b.m > 0)
      mem1[(MEM_XT + origin) % b.mem_stride] = (&(*w))[W_XT];
    mem1[(MEM_GT + origin) % b.mem_stride] = (&(*w))[W_GT];
    g1_Hg1 += ((double)(&(*w))[W_GT]) * ((&(*w))[W_GT]) * ((&(*w))[W_COND]);
    g1_g1 += ((double)((&(*w))[W_GT])) * ((&(*w))[W_GT]);
    (&(*w))[W_DIR] = -(&(*w))[W_COND] * ((&(*w))[W_GT]);
    ((&(*w))[W_GT]) = 0;
  }
  lastj = 0;
  if (!all.quiet)
    fprintf(stderr, "%-10.5f\t%-10.5f\t%-10s\t%-10s\t%-10s\t", g1_g1 / (importance_weight_sum * importance_weight_sum),
        g1_Hg1 / importance_weight_sum, "", "", "");
}